

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootup.c
# Opt level: O2

void __thiscall CMud::LoadObjLimits(CMud *this)

{
  bool bVar1;
  char cVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  size_t sVar8;
  FILE *__stream;
  char *pcVar9;
  char *pcVar10;
  OBJ_INDEX_DATA *pOVar11;
  int *piVar12;
  pointer pbVar13;
  pointer pbVar14;
  short *psVar15;
  undefined1 *this_00;
  long lVar16;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> file;
  char *local_38a0;
  string local_3898;
  string local_3878;
  CDirectory dir;
  ofstream player_list;
  char temp_player_name [4608];
  char strPlr [4608];
  char chkbuf [4608];
  
  this_00 = &this->field_0x140;
  fmt._M_str = "Loading object counts off players now...";
  fmt._M_len = 0x28;
  CLogger::Info<>((CLogger *)this_00,fmt);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3878,"../player",(allocator<char> *)&player_list);
  CDirectory::CDirectory(&dir,&local_3878);
  std::__cxx11::string::~string((string *)&local_3878);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3898,".plr",(allocator<char> *)&player_list);
  CDirectory::GetFiles(&files,&dir,&local_3898);
  std::__cxx11::string::~string((string *)&local_3898);
  std::ofstream::ofstream(&player_list,"../player/Player.lst",_S_trunc);
  pbVar14 = files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar13 = files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar14;
      pbVar13 = pbVar13 + 1) {
    std::__cxx11::string::string((string *)&file,(string *)pbVar13);
    poVar7 = std::operator<<((ostream *)&player_list,(string *)&file);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string((string *)&file);
  }
  std::ofstream::close();
  sprintf(chkbuf,"%s/%s","../player","Zzz.plr");
  pbVar14 = files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar14 ==
        files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_003b0069:
      fmt_02._M_str = "Object Limits loaded";
      fmt_02._M_len = 0x14;
      CLogger::Info<>((CLogger *)this_00,fmt_02);
      iVar5 = num_pfiles;
      psVar15 = &cabal_table[1].max_members;
      for (lVar16 = 1; lVar16 != 7; lVar16 = lVar16 + 1) {
        sVar3 = (short)(iVar5 / (int)*psVar15);
        if (sVar3 < 0x10) {
          sVar3 = 0xf;
        }
        cabal_max[lVar16] = sVar3;
        psVar15 = psVar15 + 0x14;
      }
      fmt_03._M_str = "Cabal Limits loaded";
      fmt_03._M_len = 0x13;
      CLogger::Info<>((CLogger *)this_00,fmt_03);
      std::ofstream::~ofstream(&player_list);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&files);
      CDirectory::~CDirectory(&dir);
      return;
    }
    std::__cxx11::string::string((string *)&file,(string *)pbVar14);
    strcpy(strPlr,file._M_dataplus._M_p);
    if (bDebug == true) {
      sVar8 = strlen(strPlr);
      fmt_00._M_str = strPlr;
      fmt_00._M_len = sVar8;
      CLogger::Debug<>((CLogger *)this_00,fmt_00);
    }
    bVar1 = str_cmp(strPlr,chkbuf);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&file);
      goto LAB_003b0069;
    }
    __stream = fopen(strPlr,"r");
    if (__stream == (FILE *)0x0) {
      piVar12 = __errno_location();
      local_38a0 = strerror(*piVar12);
      fmt_04._M_str = "LoadObjLimits: fopen {}: {}";
      fmt_04._M_len = 0x1b;
      CLogger::Error<char(&)[4608],char*>((CLogger *)&RS.field_0x140,fmt_04,&strPlr,&local_38a0);
      exit(1);
    }
    num_pfiles = num_pfiles + 1;
LAB_003afe47:
    do {
      temp_player_name[0] = '\0';
      cVar2 = fread_letter((FILE *)__stream);
    } while (cVar2 != '#');
    pcVar9 = fread_word((FILE *)__stream);
    bVar1 = str_cmp(pcVar9,"End");
    if (bVar1) {
      bVar1 = str_cmp(pcVar9,"PLAYER");
      iVar5 = 0;
      iVar6 = 0;
      if (!bVar1) {
        iVar5 = 0;
        iVar6 = 0;
        do {
          pcVar9 = fread_word((FILE *)__stream);
          bVar1 = str_cmp(pcVar9,"Name");
          if (!bVar1 && temp_player_name[0] == '\0') {
            pcVar10 = fread_string((FILE *)__stream);
            strcpy(temp_player_name,pcVar10);
          }
          bVar1 = str_cmp(pcVar9,"Cabal");
          if (!bVar1) {
            pcVar10 = fread_string((FILE *)__stream);
            iVar4 = cabal_lookup(pcVar10);
            cabal_members[iVar4] = cabal_members[iVar4] + 1;
          }
          bVar1 = str_cmp(pcVar9,"LogO");
          if (!bVar1 && iVar5 == 0) {
            iVar5 = fread_number((FILE *)__stream);
          }
          bVar1 = str_cmp(pcVar9,"Levl");
          if (!bVar1) {
            iVar6 = fread_number((FILE *)__stream);
          }
          bVar1 = str_cmp(pcVar9,"End");
        } while (bVar1);
      }
      if ((((iVar5 == 0) || (iVar6 == 0)) || (0x33 < iVar6)) || (current_time <= iVar5 + 0x34bc00))
      {
        bVar1 = str_cmp(pcVar9,"O");
        if (bVar1) break;
        goto LAB_003affbd;
      }
      fmt_01._M_str = "Autodeleting {}.";
      fmt_01._M_len = 0x10;
      CLogger::Info<char(&)[4608]>((CLogger *)this_00,fmt_01,&temp_player_name);
      delete_char(temp_player_name,true);
    }
    fclose(__stream);
    std::__cxx11::string::~string((string *)&file);
    pbVar14 = pbVar14 + 1;
  } while( true );
  bVar1 = str_cmp(pcVar9,"OBJECT");
  if (!bVar1) {
LAB_003affbd:
    pcVar9 = fread_word((FILE *)__stream);
    bVar1 = str_cmp(pcVar9,"Vnum");
    if (!bVar1) {
      iVar5 = fread_number((FILE *)__stream);
      pOVar11 = get_obj_index(iVar5);
      if (pOVar11 != (OBJ_INDEX_DATA *)0x0) {
        pOVar11 = get_obj_index(iVar5);
        pOVar11->limcount = pOVar11->limcount + 1;
      }
    }
  }
  goto LAB_003afe47;
}

Assistant:

void CMud::LoadObjLimits()
{
	FILE *fpChar;
	char strPlr[MAX_INPUT_LENGTH];
	char chkbuf[MAX_STRING_LENGTH];
	char temp_player_name[MSL];
	char pbuf[100];
	int i;
	long temp_bounty;
	long min_bounty = 0;
	float tempfloat;

	Logger.Info("Loading object counts off players now...");

	auto dir = CDirectory(RIFT_PLAYER_DIR);
	auto files = dir.GetFiles(".plr");

	std::ofstream player_list(PLAYER_LIST, std::ios::trunc);
	for(auto file : files) player_list << file << std::endl;
	player_list.close();

	//for(i=0;i<=MAX_TOP_BOUNTY;i++)
	//      top_bounty_value[i]=0;
	sprintf(chkbuf,"%s/%s", RIFT_PLAYER_DIR,"Zzz.plr");
	for (auto file : files)
	{
		strcpy(strPlr, file.data());
		if(bDebug)
			Logger.Debug(strPlr);

		if (!str_cmp(strPlr,chkbuf))
			break;

		fpChar = fopen(strPlr, "r");
		if (fpChar == nullptr)
		{
			RS.Logger.Error("LoadObjLimits: fopen {}: {}", strPlr, std::strerror(errno));
			exit(1);
		}

		num_pfiles++;
		temp_bounty=0;

		for (; ;)
		{
			int vnum, lastlogin = 0, plevel = 0;
			bool breakout;
			char letter;
			char *word;
			OBJ_INDEX_DATA *pObjIndex;

			temp_player_name[0] = '\0';
			letter = fread_letter(fpChar);

			if (letter != '#')
				continue;

			word = fread_word(fpChar);

			if (!str_cmp(word,"End"))
				break;

			if ( !str_cmp( word, "PLAYER"))
			{
				for ( ; ; )
				{
					word   = fread_word( fpChar );
					//NOTE: Be careful that occurrences of this word INSIDE role/desc don't fuck it up!
					//read before/after role/desc and test accordingly
					if(!str_cmp(word,"Name") && temp_player_name[0] == '\0')
						sprintf(temp_player_name,"%s",fread_string( fpChar ));
					if(!str_cmp(word,"Cabal"))
						cabal_members[cabal_lookup(fread_string(fpChar))]++;
					if(!str_cmp(word,"LogO") && lastlogin == 0)
						lastlogin = fread_number(fpChar);
					if(!str_cmp(word,"Levl"))
						plevel = fread_number(fpChar);
					if(!str_cmp(word,"End"))
						break;
				}
			}

			if(lastlogin && plevel && plevel < 52 && lastlogin + 3456000 < current_time)
			{
				Logger.Info("Autodeleting {}.", temp_player_name);
				breakout = true;
				delete_char(temp_player_name, true);
				break;
			}

			if ( !str_cmp( word, "O") || !str_cmp( word, "OBJECT"))
			{
				word = fread_word(fpChar);

				if (!str_cmp(word, "Vnum"))
				{
					vnum = fread_number(fpChar);
					if ( (get_obj_index(vnum)) != nullptr)
					{
						pObjIndex = get_obj_index(vnum);
						pObjIndex->limcount++;
					}
				}
			}
		}

		fclose(fpChar);
		fpChar = nullptr;
	}